

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombLoops.cpp
# Opt level: O2

void __thiscall
StrongConnectedComponents::buildAdjList
          (StrongConnectedComponents *this,vector<int,_std::allocator<int>_> *nodes,SCCResult *sccr)

{
  int iVar1;
  pointer pvVar2;
  pointer piVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pvVar7;
  int succ;
  long local_50;
  StrongConnectedComponents *local_48;
  SCCResult *local_40;
  long local_38;
  
  local_50 = (long)(nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(&sccr->adjList);
  local_48 = this;
  local_40 = sccr;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&sccr->adjList,
           ((long)(this->adjList).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->adjList).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  if ((nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start !=
      (nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_50 = local_50 >> 2;
    for (local_38 = 0; local_38 != local_50; local_38 = local_38 + 1) {
      iVar1 = (nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_start[local_38];
      pvVar2 = (local_40->adjList).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar7 = (local_48->adjList).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar1;
      piVar3 = *(pointer *)&pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl;
      if (*(pointer *)
           ((long)&pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) !=
          piVar3) {
        pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar3;
      }
      uVar5 = (ulong)((long)*(pointer *)
                             ((long)&(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                     .super__Vector_impl_data + 8) -
                     *(long *)&(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data) >> 2;
      uVar6 = uVar5 & 0xffffffff;
      if ((int)uVar5 < 1) {
        uVar6 = 0;
      }
      for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        succ = *(int *)(*(long *)&(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data + uVar5 * 4);
        bVar4 = find_vec<int>(nodes,&succ);
        if (bVar4) {
          std::vector<int,_std::allocator<int>_>::push_back(pvVar2 + iVar1,&succ);
        }
      }
    }
  }
  return;
}

Assistant:

void StrongConnectedComponents::buildAdjList(const std::vector<int>& nodes, SCCResult& sccr) const {
    std::vector<std::vector<int>>& lowestIdAdjacencyList = sccr.getAdjListForWrite();
    auto nodes_s = nodes.size();
    lowestIdAdjacencyList.clear();
    lowestIdAdjacencyList.resize(adjList.size());
    if (!nodes.empty()) {
        for (int i = 0; i < nodes_s; i++) {
            int node = nodes[i];
            std::vector<int>& sccr_adjlist_node = lowestIdAdjacencyList[node];
            auto& adjList_node = adjList[node];
            sccr_adjlist_node.clear();
            const int ns = adjList_node.size();
            for (int j = 0; j < ns; j++) {
                int succ = adjList_node[j];
                if (find_vec(nodes, succ)) {
                    sccr_adjlist_node.push_back(succ);
                }
            }
        }
    }
}